

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool duckdb::StandardNumericToDecimalCast<unsigned_int,short,duckdb::UnsignedToDecimalOperator>
               (uint input,short *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  short sVar1;
  string *msg;
  ulong uVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  uchar in_R9B;
  string error;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  msg = (string *)(ulong)input;
  uVar2 = CONCAT71(in_register_00000081,scale) & 0xffffffff;
  sVar1 = *(short *)(NumericHelper::POWERS_OF_TEN +
                    ((CONCAT71(in_register_00000009,width) & 0xffffffff) - uVar2) * 8);
  if (msg < (string *)(long)sVar1) {
    *result = (short)*(undefined4 *)(NumericHelper::POWERS_OF_TEN + uVar2 * 8) * (short)input;
  }
  else {
    local_70[0] = local_60;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Could not cast value %d to DECIMAL(%d,%d)","");
    Exception::ConstructMessage<unsigned_int,unsigned_char,unsigned_char>
              (&local_50,(Exception *)local_70,msg,(uint)width,scale,in_R9B);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    HandleCastError::AssignError(&local_50,parameters);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return msg < (string *)(long)sVar1;
}

Assistant:

bool StandardNumericToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	DST max_width = UnsafeNumericCast<DST>(NumericHelper::POWERS_OF_TEN[width - scale]);
	if (OP::template Operation<SRC, DST>(input, max_width)) {
		string error = StringUtil::Format("Could not cast value %d to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = UnsafeNumericCast<DST>(DST(input) * NumericHelper::POWERS_OF_TEN[scale]);
	return true;
}